

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt8x16Operation::OpNeg(SIMDValue *value)

{
  _x86_SIMDValue _Var1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  ulong uStack_d8;
  X86SIMDValue v;
  X86SIMDValue negativeOnes;
  X86SIMDValue temp;
  X86SIMDValue SIGNMASK;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(value);
  uStack_d8 = _Var1.field_0._0_8_;
  uStack_d8 = ~uStack_d8;
  SIGNMASK.field_0.i64[0] = 0x101010101010101;
  local_28 = (char)uStack_d8;
  cStack_27 = (char)(uStack_d8 >> 8);
  cStack_26 = (char)(uStack_d8 >> 0x10);
  cStack_25 = (char)(uStack_d8 >> 0x18);
  cStack_24 = (char)(uStack_d8 >> 0x20);
  cStack_23 = (char)(uStack_d8 >> 0x28);
  cStack_22 = (char)(uStack_d8 >> 0x30);
  cStack_21 = (char)(uStack_d8 >> 0x38);
  SIGNMASK.field_0.i8[8] = local_28 + '\x01';
  SIGNMASK.field_0.i8[9] = cStack_27 + '\x01';
  SIGNMASK.field_0.i8[10] = cStack_26 + '\x01';
  SIGNMASK.field_0.i8[0xb] = cStack_25 + '\x01';
  SIGNMASK.field_0.i8[0xc] = cStack_24 + '\x01';
  SIGNMASK.field_0.i8[0xd] = cStack_23 + '\x01';
  SIGNMASK.field_0.i8[0xe] = cStack_22 + '\x01';
  SIGNMASK.field_0.i8[0xf] = cStack_21 + '\x01';
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&SIGNMASK.field_0 + 8));
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpNeg(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue SIGNMASK, temp;
        X86SIMDValue negativeOnes = { { -1, -1, -1, -1 } };
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        temp.m128i_value = _mm_andnot_si128(v.m128i_value, negativeOnes.m128i_value); // (~value) & (negative ones)
        SIGNMASK.m128i_value = _mm_set1_epi8(0x00000001);                            // set SIGNMASK to 1
        x86Result.m128i_value = _mm_add_epi8(SIGNMASK.m128i_value, temp.m128i_value);// add 16 integers respectively

        return X86SIMDValue::ToSIMDValue(x86Result);
    }